

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall
wabt::TypeChecker::CheckOpcode3
          (TypeChecker *this,Opcode opcode,Limits *limits1,Limits *limits2,Limits *limits3)

{
  Result RVar1;
  Type TVar2;
  Type TVar3;
  Type TVar4;
  char *desc;
  Opcode local_34;
  
  TVar2 = Opcode::GetParamType1(&local_34);
  TVar2 = GetMemoryParam(TVar2,limits1);
  TVar3 = Opcode::GetParamType2(&local_34);
  TVar3 = GetMemoryParam(TVar3,limits2);
  TVar4 = Opcode::GetParamType3(&local_34);
  TVar4 = GetMemoryParam(TVar4,limits3);
  desc = Opcode::GetName(&local_34);
  RVar1 = PopAndCheck3Types(this,TVar2,TVar3,TVar4,desc);
  TVar2 = Opcode::GetResultType(&local_34);
  PushType(this,TVar2);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode3(Opcode opcode,
                                 const Limits* limits1,
                                 const Limits* limits2,
                                 const Limits* limits3) {
  Result result = PopAndCheck3Types(
      GetMemoryParam(opcode.GetParamType1(), limits1),
      GetMemoryParam(opcode.GetParamType2(), limits2),
      GetMemoryParam(opcode.GetParamType3(), limits3), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}